

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::InverseNodeSearch
          (Discreet3DSImporter *this,Node *pcNode,Node *pcCurrent)

{
  Node *pNVar1;
  Node *pNStack_18;
  
  do {
    pNVar1 = pcCurrent;
    if (pNVar1 == (Node *)0x0) {
      D3DS::Node::push_back(this->mRootNode,pcNode);
      return;
    }
    pcCurrent = pNVar1->mParent;
  } while (pNVar1->mHierarchyPos != pcNode->mHierarchyPos);
  if (pcCurrent != (Node *)0x0) {
    D3DS::Node::push_back(pcCurrent,pcNode);
    return;
  }
  pNStack_18 = pcNode;
  std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::push_back
            (&pNVar1->mChildren,&pNStack_18);
  pNStack_18->mParent = pNVar1;
  return;
}

Assistant:

void Discreet3DSImporter::InverseNodeSearch(D3DS::Node* pcNode,D3DS::Node* pcCurrent)
{
    if (!pcCurrent) {
        mRootNode->push_back(pcNode);
        return;
    }

    if (pcCurrent->mHierarchyPos == pcNode->mHierarchyPos)  {
        if(pcCurrent->mParent) {
            pcCurrent->mParent->push_back(pcNode);
        }
        else pcCurrent->push_back(pcNode);
        return;
    }
    return InverseNodeSearch(pcNode,pcCurrent->mParent);
}